

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::immediate
               (AccessType param_1,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  undefined7 in_register_00000031;
  MicroOp local_c [4];
  
  if ((int)CONCAT71(in_register_00000031,is8bit) == 0) {
    local_c[0] = CycleFetchIncrementPC;
    if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003e93bc;
    (*target->_M_invoker)((_Any_data *)target,local_c);
  }
  local_c[1] = 0;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_c + 1);
    local_c[2] = 0x31;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_c + 2);
      local_c[3] = 0x2e;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_c + 3);
        return;
      }
    }
  }
LAB_003e93bc:
  std::__throw_bad_function_call();
}

Assistant:

static void immediate(AccessType, bool is8bit, const std::function<void(MicroOp)> &target) {
		if(!is8bit) target(CycleFetchIncrementPC);	// IDL.
		target(CycleFetchIncrementPC);				// ID [H].
		target(OperationCopyInstructionToData);
		target(OperationPerform);
	}